

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O2

int __thiscall rcg::Stream::close(Stream *this,int __fd)

{
  int iVar1;
  
  std::recursive_mutex::lock(&this->mtx);
  if ((0 < this->n_open) && (iVar1 = this->n_open + -1, this->n_open = iVar1, iVar1 == 0)) {
    stopStreaming(this);
  }
  iVar1 = pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  return iVar1;
}

Assistant:

void Stream::close()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);

  if (n_open > 0)
  {
    n_open--;

    if (n_open == 0)
    {
      try
      {
        stopStreaming();
      }
      catch (...)
      {
        gentl->DSClose(stream);
        stream=0;

        buffer.setNodemap(0, "");

        nodemap=0;
        cport=0;

        throw;
      }
    }
  }
}